

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::SplitBranch<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>,_2UL>::get
          (SplitBranch<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>,_2UL> *this,
          ExceptionOrValue *output)

{
  ExceptionOrValue *this_00;
  ExceptionOr<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>_> *other;
  Tuple<int,_kj::String,_kj::Promise<int>_> *tuple;
  TypeByIndex<2UL,_int,_kj::String,_kj::Promise<int>_> *t;
  Promise<int> *other_00;
  ExceptionOr<kj::Promise<int>_> *pEVar1;
  Tuple<int,_kj::String,_kj::Promise<int>_> *value;
  ExceptionOr<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>_> *hubResult;
  ExceptionOrValue *output_local;
  SplitBranch<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>,_2UL> *this_local;
  
  this_00 = ForkBranchBase::getHubResultRef(&this->super_ForkBranchBase);
  other = ExceptionOrValue::as<kj::_::Tuple<int,kj::String,kj::Promise<int>>>(this_00);
  tuple = readMaybe<kj::_::Tuple<int,kj::String,kj::Promise<int>>>(&other->value);
  if (tuple == (Tuple<int,_kj::String,_kj::Promise<int>_> *)0x0) {
    pEVar1 = ExceptionOrValue::as<kj::Promise<int>>(output);
    Maybe<kj::Promise<int>_>::operator=(&pEVar1->value,(void *)0x0);
  }
  else {
    t = get<2ul,kj::_::Tuple<int,kj::String,kj::Promise<int>>&>(tuple);
    other_00 = mv<kj::Promise<int>>(t);
    pEVar1 = ExceptionOrValue::as<kj::Promise<int>>(output);
    Maybe<kj::Promise<int>_>::operator=(&pEVar1->value,other_00);
  }
  Maybe<kj::Exception>::operator=(&output->exception,(Maybe<kj::Exception> *)other);
  ForkBranchBase::releaseHub(&this->super_ForkBranchBase,output);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    ExceptionOr<T>& hubResult = getHubResultRef().template as<T>();
    KJ_IF_MAYBE(value, hubResult.value) {
      output.as<Element>().value = kj::mv(kj::get<index>(*value));
    } else {
      output.as<Element>().value = nullptr;
    }